

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O1

ZyanStatus
ZydisReadImmediate(ZydisDecoderState *state,ZydisDecodedInstruction *instruction,ZyanU8 id,
                  ZyanU8 size,ZyanBool is_signed,ZyanBool is_relative)

{
  byte bVar1;
  ZyanUSize ZVar2;
  byte *pbVar3;
  bool bVar4;
  ZyanStatus ZVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  if (1 < id) {
    __assert_fail("(id == 0) || (id == 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x319,
                  "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                 );
  }
  if (is_relative != '\0' && is_signed == '\0') {
    __assert_fail("is_signed || !is_relative",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x31a,
                  "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                 );
  }
  if ((instruction->raw).imm[id].size != '\0') {
    __assert_fail("instruction->raw.imm[id].size == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x31b,
                  "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                 );
  }
  (instruction->raw).imm[id].size = size;
  bVar1 = instruction->length;
  (instruction->raw).imm[id].offset = bVar1;
  (instruction->raw).imm[id].is_signed = is_signed;
  (instruction->raw).imm[id].is_relative = is_relative;
  uVar7 = (uint)size << 0x1d | size - 8 >> 3;
  if (7 < uVar7) {
switchD_00113b87_caseD_2:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x358,
                  "ZyanStatus ZydisReadImmediate(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanBool, ZyanBool)"
                 );
  }
  uVar8 = (long)&switchD_00113b87::switchdataD_0011ecc8 +
          (long)(int)(&switchD_00113b87::switchdataD_0011ecc8)[uVar7];
  switch(uVar7) {
  case 0:
    if (bVar1 < 0xf) {
      ZVar2 = state->buffer_len;
      if (ZVar2 == 0) {
        ZVar5 = 0x80200000;
        goto LAB_00113cd1;
      }
      pbVar3 = state->buffer;
      state->buffer = pbVar3 + 1;
      uVar8 = (ulong)*pbVar3;
      instruction->length = bVar1 + 1;
      state->buffer_len = ZVar2 - 1;
      ZVar5 = 0x100000;
      bVar4 = true;
    }
    else {
      ZVar5 = 0x80200002;
LAB_00113cd1:
      bVar4 = false;
    }
    if (!bVar4) {
      return ZVar5;
    }
    uVar6 = (ulong)(char)uVar8;
    uVar8 = uVar8 & 0xff;
    break;
  case 1:
    if (bVar1 < 0xe) {
      uVar6 = state->buffer_len;
      if (uVar6 < 2) {
        ZVar5 = 0x80200000;
        goto LAB_00113bfb;
      }
      instruction->length = bVar1 + 2;
      uVar8 = (ulong)*(ushort *)state->buffer;
      state->buffer = (ZyanU8 *)((long)state->buffer + 2);
      state->buffer_len = uVar6 - 2;
      ZVar5 = 0x100000;
      bVar4 = true;
    }
    else {
      ZVar5 = 0x80200002;
LAB_00113bfb:
      bVar4 = false;
    }
    if (!bVar4) {
      return ZVar5;
    }
    uVar6 = (ulong)(short)uVar8;
    uVar8 = uVar8 & 0xffff;
    break;
  default:
    goto switchD_00113b87_caseD_2;
  case 3:
    if (bVar1 < 0xc) {
      uVar6 = state->buffer_len;
      if (uVar6 < 4) {
        ZVar5 = 0x80200000;
        goto LAB_00113bc7;
      }
      instruction->length = bVar1 + 4;
      uVar8 = (ulong)*(uint *)state->buffer;
      state->buffer = (ZyanU8 *)((long)state->buffer + 4);
      state->buffer_len = uVar6 - 4;
      ZVar5 = 0x100000;
      bVar4 = true;
    }
    else {
      ZVar5 = 0x80200002;
LAB_00113bc7:
      bVar4 = false;
    }
    if (!bVar4) {
      return ZVar5;
    }
    uVar6 = (ulong)(int)uVar8;
    uVar8 = uVar8 & 0xffffffff;
    break;
  case 7:
    if (bVar1 < 8) {
      uVar6 = state->buffer_len;
      if (uVar6 < 8) {
        ZVar5 = 0x80200000;
        goto LAB_00113be1;
      }
      instruction->length = bVar1 + 8;
      uVar8 = *(ulong *)state->buffer;
      state->buffer = (ZyanU8 *)((long)state->buffer + 8);
      state->buffer_len = uVar6 - 8;
      ZVar5 = 0x100000;
      bVar4 = true;
    }
    else {
      ZVar5 = 0x80200002;
LAB_00113be1:
      bVar4 = false;
    }
    if (!bVar4) {
      return ZVar5;
    }
    goto LAB_00113ce6;
  }
  if (is_signed != '\0') {
    uVar8 = uVar6;
  }
LAB_00113ce6:
  (instruction->raw).imm[id].value.u = uVar8;
  return 0x100000;
}

Assistant:

static ZyanStatus ZydisReadImmediate(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, ZyanU8 id, ZyanU8 size, ZyanBool is_signed,
    ZyanBool is_relative)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT((id == 0) || (id == 1));
    ZYAN_ASSERT(is_signed || !is_relative);
    ZYAN_ASSERT(instruction->raw.imm[id].size == 0);

    instruction->raw.imm[id].size = size;
    instruction->raw.imm[id].offset = instruction->length;
    instruction->raw.imm[id].is_signed = is_signed;
    instruction->raw.imm[id].is_relative = is_relative;
    switch (size)
    {
    case 8:
    {
        ZyanU8 value;
        ZYAN_CHECK(ZydisInputNext(state, instruction, &value));
        if (is_signed)
        {
            instruction->raw.imm[id].value.s = (ZyanI8)value;
        } else
        {
            instruction->raw.imm[id].value.u = value;
        }
        break;
    }
    case 16:
    {
        ZyanU16 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 2));
        if (is_signed)
        {
            instruction->raw.imm[id].value.s = (ZyanI16)value;
        } else
        {
            instruction->raw.imm[id].value.u = value;
        }
        break;
    }
    case 32:
    {
        ZyanU32 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 4));
        if (is_signed)
        {
            instruction->raw.imm[id].value.s = (ZyanI32)value;
        } else
        {
            instruction->raw.imm[id].value.u = value;
        }
        break;
    }
    case 64:
    {
        ZyanU64 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 8));
        if (is_signed)
        {
            instruction->raw.imm[id].value.s = (ZyanI64)value;
        } else
        {
            instruction->raw.imm[id].value.u = value;
        }
        break;
    }
    default:
        ZYAN_UNREACHABLE;
    }

    // TODO: Fix endianess on big-endian systems

    return ZYAN_STATUS_SUCCESS;
}